

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void nn_timer_term(nn_timer *self)

{
  nn_fsm *self_00;
  
  self_00 = (nn_fsm *)(ulong)(uint)self->state;
  if (self->state == 1) {
    nn_fsm_event_term(&self->done);
    nn_worker_timer_term(&self->wtimer);
    nn_worker_task_term(&self->stop_task);
    nn_worker_task_term(&self->start_task);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_timer_term_cold_1();
  nn_fsm_isidle(self_00);
  return;
}

Assistant:

void nn_timer_term (struct nn_timer *self)
{
    nn_assert_state (self, NN_TIMER_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_worker_timer_term (&self->wtimer);
    nn_worker_task_term (&self->stop_task);
    nn_worker_task_term (&self->start_task);
    nn_fsm_term (&self->fsm);
}